

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall
QWidgetPrivate::invalidateBackingStore_resizeHelper
          (QWidgetPrivate *this,QPoint *oldPos,QSize *oldSize)

{
  QRect *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QRect *withinClipRect;
  QWExtra *pQVar6;
  QGraphicsEffect *this_00;
  QWidgetPrivate *this_01;
  QPoint QVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  QRect QVar12;
  QRect QVar13;
  QPoint QVar14;
  char cVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  QWidget *pQVar19;
  long lVar20;
  QPoint *this_02;
  int iVar21;
  int iVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  Representation RVar24;
  Representation RVar25;
  QRect QVar26;
  QRegion staticChildren;
  QRegion parentExpose;
  QRegion dirty;
  undefined1 local_a8 [8];
  QPoint local_a0;
  QRect local_98;
  QRect local_88;
  QPoint local_78;
  double dStack_70;
  double local_68;
  double local_60;
  QRect local_58 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  withinClipRect = *(QRect **)&this->field_0x8;
  lVar20 = *(long *)(withinClipRect + 2);
  iVar18 = (this->data).crect.x1.m_i;
  iVar17 = ((this->data).crect.x2.m_i - iVar18) + 1;
  iVar22 = (oldSize->wd).m_i;
  bVar16 = true;
  if (iVar22 <= iVar17) {
    bVar16 = ((this->data).crect.y2.m_i - (this->data).crect.y1.m_i) + 1 < (oldSize->ht).m_i;
  }
  iVar2 = (oldPos->xp).m_i;
  iVar3 = (oldPos->yp).m_i;
  iVar4 = (this->data).crect.y1.m_i;
  bVar10 = iVar4 != iVar3;
  bVar11 = iVar18 != iVar2;
  local_88.x2.m_i = *(int *)(lVar20 + 0x1c) - *(int *)(lVar20 + 0x14);
  pQVar1 = &(this->data).crect;
  bVar9 = (bool)(bVar16 | (bVar10 || bVar11));
  local_88.y2.m_i = *(int *)(lVar20 + 0x20) - *(int *)(lVar20 + 0x18);
  local_88.x1.m_i = 0;
  local_88.y1.m_i = 0;
  iVar5 = (oldSize->ht).m_i;
  local_98.x1.m_i = 0;
  local_98.y1.m_i = 0;
  local_98.y2.m_i = iVar5 + -1;
  local_98.x2.m_i = iVar22 + -1;
  if (((*(uint *)(lVar20 + 8) & 0x20) == 0) || (this->graphicsEffect != (QGraphicsEffect *)0x0)) {
    local_a0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)&local_a0);
    if (!bVar10 && !bVar11) {
      pQVar19 = QWidget::window(*(QWidget **)&this->field_0x8);
      lVar20 = *(long *)(*(long *)&pQVar19->field_0x8 + 0x78);
      if (lVar20 == 0) {
        lVar20 = 0;
      }
      else {
        lVar20 = *(long *)(lVar20 + 8);
      }
      if (lVar20 == 0) {
        pQVar19 = (QWidget *)0x0;
      }
      else {
        pQVar19 = *(QWidget **)(lVar20 + 8);
      }
      if (pQVar19 != (QWidget *)0x0) {
        QWidgetRepaintManager::staticContents
                  ((QWidgetRepaintManager *)local_58,pQVar19,withinClipRect);
        QVar7 = local_a0;
        local_a0.xp.m_i = local_58[0].x1.m_i;
        local_a0.yp.m_i = local_58[0].y1.m_i;
        QVar14 = local_a0;
        local_a0.xp = QVar7.xp.m_i;
        local_a0.yp = QVar7.yp.m_i;
        local_58[0].x1.m_i = local_a0.xp.m_i;
        local_58[0].y1.m_i = local_a0.yp.m_i;
        local_a0 = QVar14;
        QRegion::~QRegion((QRegion *)local_58);
      }
    }
    cVar15 = QRegion::isEmpty();
    if (cVar15 == '\0') {
      local_58[0]._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)local_58,&local_88,Rectangle);
      QRegion::operator-=((QRegion *)local_58,(QRegion *)&local_a0);
      invalidateBackingStore<QRegion>(this,(QRegion *)local_58);
      QRegion::~QRegion((QRegion *)local_58);
    }
    else {
      invalidateBackingStore<QRect>(this,&local_88);
    }
    QVar13.x2.m_i = local_58[0].x2.m_i;
    QVar13.y2.m_i = local_58[0].y2.m_i;
    QVar13.x1.m_i = local_58[0].x1.m_i;
    QVar13.y1.m_i = local_58[0].y1.m_i;
    if (bVar9) {
      this_00 = this->graphicsEffect;
      if (((this_00 == (QGraphicsEffect *)0x0) &&
          (pQVar6 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>
                    ._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                    super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl, pQVar6 != (QWExtra *)0x0))
         && ((pQVar6->field_0x7c & 0x80) != 0)) {
        local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::translated((int)&local_78,(int)pQVar6 + 0x40);
        local_58[0]._0_8_ = *oldPos;
        local_58[0].x2.m_i = (*oldSize).wd.m_i + (int)local_58[0]._0_8_ + -1;
        local_58[0].y2.m_i = (*oldSize).ht.m_i + SUB84(local_58[0]._0_8_,4) + -1;
        QRegion::operator&=((QRegion *)&local_78,local_58);
        if (cVar15 == '\0') {
          QRegion::QRegion((QRegion *)local_58,pQVar1,Rectangle);
          QRegion::operator-=((QRegion *)&local_78,(QRegion *)local_58);
          QRegion::~QRegion((QRegion *)local_58);
        }
        invalidateBackingStore<QRegion>
                  (*(QWidgetPrivate **)(*(long *)(*(long *)&withinClipRect->x2 + 0x10) + 8),
                   (QRegion *)&local_78);
      }
      else {
        if (cVar15 != '\0' || this_00 != (QGraphicsEffect *)0x0) {
          this_01 = *(QWidgetPrivate **)(*(long *)(*(long *)&withinClipRect->x2 + 0x10) + 8);
          QVar7 = *oldPos;
          RVar24 = QVar7.xp.m_i;
          RVar25 = QVar7.yp.m_i;
          uVar23 = (ulong)(uint)RVar25.m_i << 0x20 | (ulong)QVar7 & 0xffffffff;
          iVar22 = RVar24.m_i + (oldSize->wd).m_i + -1;
          iVar18 = (oldSize->ht).m_i + RVar25.m_i + -1;
          QVar12.x2.m_i = iVar22;
          QVar12.y2.m_i = iVar18;
          QVar12.x1.m_i = (int)uVar23;
          QVar12.y1.m_i = (int)(uVar23 >> 0x20);
          QVar26.x2.m_i = iVar22;
          QVar26.y2.m_i = iVar18;
          QVar26.x1.m_i = (int)uVar23;
          QVar26.y1.m_i = (int)(uVar23 >> 0x20);
          if ((this_00 != (QGraphicsEffect *)0x0) &&
             (bVar16 = QGraphicsEffect::isEnabled(this_00), QVar26 = QVar12, bVar16)) {
            local_78 = (QPoint)(double)RVar24.m_i;
            dStack_70 = (double)RVar25.m_i;
            local_68 = (double)(((long)iVar22 - (long)RVar24.m_i) + 1);
            local_60 = (double)(((long)iVar18 - (long)RVar25.m_i) + 1);
            (**(code **)(*(long *)this->graphicsEffect + 0x60))(local_58);
            QVar26 = (QRect)QRectF::toAlignedRect();
          }
          local_58[0] = QVar26;
          invalidateBackingStore<QRect>(this_01,local_58);
          QVar13 = local_58[0];
          goto LAB_0031e0ff;
        }
        local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        local_58[0]._0_8_ = *oldPos;
        local_58[0].x2.m_i = (*oldSize).wd.m_i + (int)local_58[0]._0_8_ + -1;
        local_58[0].y2.m_i = (*oldSize).ht.m_i + SUB84(local_58[0]._0_8_,4) + -1;
        QRegion::QRegion((QRegion *)&local_78,local_58,Rectangle);
        QRegion::QRegion((QRegion *)local_58,pQVar1,Rectangle);
        QRegion::operator-=((QRegion *)&local_78,(QRegion *)local_58);
        QRegion::~QRegion((QRegion *)local_58);
        invalidateBackingStore<QRegion>
                  (*(QWidgetPrivate **)(*(long *)(*(long *)&withinClipRect->x2 + 0x10) + 8),
                   (QRegion *)&local_78);
      }
      QRegion::~QRegion((QRegion *)&local_78);
      QVar13.x2.m_i = local_58[0].x2.m_i;
      QVar13.y2.m_i = local_58[0].y2.m_i;
      QVar13.x1.m_i = local_58[0].x1.m_i;
      QVar13.y1.m_i = local_58[0].y1.m_i;
    }
LAB_0031e0ff:
    this_02 = &local_a0;
  }
  else {
    if (bVar10 || bVar11) {
      iVar21 = iVar5;
      iVar8 = iVar22;
      if (bVar16) {
        iVar8 = iVar17;
        if (iVar22 < iVar17) {
          iVar8 = iVar22;
        }
        iVar21 = ((this->data).crect.y2.m_i - iVar4) + 1;
        if (iVar5 < iVar21) {
          iVar21 = iVar5;
        }
      }
      local_58[0].y2.m_i = iVar3 + iVar21 + -1;
      local_58[0].x2.m_i = iVar8 + iVar2 + -1;
      local_58[0]._0_8_ = *oldPos;
      moveRect(this,local_58,iVar18 - iVar2,iVar4 - iVar3);
    }
    if ((!bVar16) || (cVar15 = QRect::contains(&local_98,SUB81(&local_88,0)), cVar15 == '\0')) {
      local_58[0]._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)local_58,&local_88,Rectangle);
      QRegion::QRegion((QRegion *)&local_78,&local_98,Rectangle);
      QRegion::operator-=((QRegion *)local_58,(QRegion *)&local_78);
      QRegion::~QRegion((QRegion *)&local_78);
      invalidateBackingStore<QRegion>(this,(QRegion *)local_58);
      QRegion::~QRegion((QRegion *)local_58);
    }
    if (!bVar9) goto LAB_0031e109;
    local_58[0]._0_8_ = *oldPos;
    local_58[0].x2.m_i = (*oldSize).wd.m_i + (int)local_58[0]._0_8_ + -1;
    local_58[0].y2.m_i = (*oldSize).ht.m_i + SUB84(local_58[0]._0_8_,4) + -1;
    pQVar6 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar6 == (QWExtra *)0x0) || ((pQVar6->field_0x7c & 0x80) == 0)) {
      this_02 = &local_78;
      local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)this_02,local_58,Rectangle);
      QRegion::QRegion((QRegion *)&local_a0,pQVar1,Rectangle);
      QRegion::operator-=((QRegion *)this_02,(QRegion *)&local_a0);
      QRegion::~QRegion((QRegion *)&local_a0);
      invalidateBackingStore<QRegion>
                (*(QWidgetPrivate **)(*(long *)(*(long *)&withinClipRect->x2 + 0x10) + 8),
                 (QRegion *)this_02);
      QVar13.x2.m_i = local_58[0].x2.m_i;
      QVar13.y2.m_i = local_58[0].y2.m_i;
      QVar13.x1.m_i = local_58[0].x1.m_i;
      QVar13.y1.m_i = local_58[0].y1.m_i;
    }
    else {
      this_02 = &local_78;
      local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)this_02,local_58,Rectangle);
      QRegion::translated((int)&local_a0,
                          (int)(this->extra)._M_t.
                               super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl + 0x40);
      QRegion::operator&=((QRegion *)this_02,(QRegion *)&local_a0);
      QRegion::~QRegion((QRegion *)&local_a0);
      QRegion::translated((int)(QRect *)local_a8,
                          (int)(this->extra)._M_t.
                               super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl + 0x40);
      QRegion::operator&((QRegion *)&local_a0,(QRect *)local_a8);
      QRegion::operator-=((QRegion *)this_02,(QRegion *)&local_a0);
      QRegion::~QRegion((QRegion *)&local_a0);
      QRegion::~QRegion((QRegion *)local_a8);
      invalidateBackingStore<QRegion>
                (*(QWidgetPrivate **)(*(long *)(*(long *)&withinClipRect->x2 + 0x10) + 8),
                 (QRegion *)this_02);
      QVar13.x2.m_i = local_58[0].x2.m_i;
      QVar13.y2.m_i = local_58[0].y2.m_i;
      QVar13.x1.m_i = local_58[0].x1.m_i;
      QVar13.y1.m_i = local_58[0].y1.m_i;
    }
  }
  local_58[0] = QVar13;
  QRegion::~QRegion((QRegion *)this_02);
LAB_0031e109:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::invalidateBackingStore_resizeHelper(const QPoint &oldPos, const QSize &oldSize)
{
    Q_Q(QWidget);
    Q_ASSERT(!q->isWindow());
    Q_ASSERT(q->parentWidget());

    const bool staticContents = q->testAttribute(Qt::WA_StaticContents);
    const bool sizeDecreased = (data.crect.width() < oldSize.width())
                               || (data.crect.height() < oldSize.height());

    const QPoint offset(data.crect.x() - oldPos.x(), data.crect.y() - oldPos.y());
    const bool parentAreaExposed = !offset.isNull() || sizeDecreased;
    const QRect newWidgetRect(q->rect());
    const QRect oldWidgetRect(0, 0, oldSize.width(), oldSize.height());

    if (!staticContents || graphicsEffect) {
        QRegion staticChildren;
        QWidgetRepaintManager *bs = nullptr;
        if (offset.isNull() && (bs = maybeRepaintManager()))
            staticChildren = bs->staticContents(q, oldWidgetRect);
        const bool hasStaticChildren = !staticChildren.isEmpty();

        if (hasStaticChildren) {
            QRegion dirty(newWidgetRect);
            dirty -= staticChildren;
            invalidateBackingStore(dirty);
        } else {
            // Entire widget needs repaint.
            invalidateBackingStore(newWidgetRect);
        }

        if (!parentAreaExposed)
            return;

        // Invalidate newly exposed area of the parent.
        if (!graphicsEffect && extra && extra->hasMask) {
            QRegion parentExpose(extra->mask.translated(oldPos));
            parentExpose &= QRect(oldPos, oldSize);
            if (hasStaticChildren)
                parentExpose -= data.crect; // Offset is unchanged, safe to do this.
            q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
        } else {
            if (hasStaticChildren && !graphicsEffect) {
                QRegion parentExpose(QRect(oldPos, oldSize));
                parentExpose -= data.crect; // Offset is unchanged, safe to do this.
                q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
            } else {
                q->parentWidget()->d_func()->invalidateBackingStore(effectiveRectFor(QRect(oldPos, oldSize)));
            }
        }
        return;
    }

    // Move static content to its new position.
    if (!offset.isNull()) {
        if (sizeDecreased) {
            const QSize minSize(qMin(oldSize.width(), data.crect.width()),
                                qMin(oldSize.height(), data.crect.height()));
            moveRect(QRect(oldPos, minSize), offset.x(), offset.y());
        } else {
            moveRect(QRect(oldPos, oldSize), offset.x(), offset.y());
        }
    }

    // Invalidate newly visible area of the widget.
    if (!sizeDecreased || !oldWidgetRect.contains(newWidgetRect)) {
        QRegion newVisible(newWidgetRect);
        newVisible -= oldWidgetRect;
        invalidateBackingStore(newVisible);
    }

    if (!parentAreaExposed)
        return;

    // Invalidate newly exposed area of the parent.
    const QRect oldRect(oldPos, oldSize);
    if (extra && extra->hasMask) {
        QRegion parentExpose(oldRect);
        parentExpose &= extra->mask.translated(oldPos);
        parentExpose -= (extra->mask.translated(data.crect.topLeft()) & data.crect);
        q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
    } else {
        QRegion parentExpose(oldRect);
        parentExpose -= data.crect;
        q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
    }
}